

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::StringTable_&>::
MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::StringTable_&>
                *this,StringTable *container,MatchResultListener *listener)

{
  bool bVar1;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *this_00;
  const_iterator elem_first;
  const_iterator elem_last;
  bool local_c2;
  undefined1 local_68 [8];
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  StlContainerReference stl_container;
  MatchResultListener *listener_local;
  StringTable *container_local;
  UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::StringTable_&>
  *this_local;
  
  this_00 = &StlContainerView<phmap::priv::(anonymous_namespace)::StringTable>::ConstReference
                       (container)->
             super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  elem_first = phmap::priv::
               raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
               ::begin(this_00);
  elem_last = phmap::priv::
              raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              ::end(this_00);
  UnorderedElementsAreMatcherImpl<phmap::priv::(anonymous_namespace)::StringTable_const&>::
  AnalyzeElements<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::const_iterator>
            ((MatchMatrix *)local_68,
             (UnorderedElementsAreMatcherImpl<phmap::priv::(anonymous_namespace)::StringTable_const&>
              *)this,elem_first,elem_last,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             listener);
  bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,(MatchMatrix *)local_68,listener);
  local_c2 = false;
  if (bVar1) {
    local_c2 = UnorderedElementsAreMatcherImplBase::FindPairing
                         (&this->super_UnorderedElementsAreMatcherImplBase,(MatchMatrix *)local_68,
                          listener);
  }
  MatchMatrix::~MatchMatrix((MatchMatrix *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return local_c2;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }